

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O1

int FindLatestMTMessage(uchar *buf,int buflen,int addr,int mid,uchar **pFoundMsg,
                       int *pFoundMsgTmpLen)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  do {
    if ((((4 < buflen) && (*buf == 0xfa)) && (buf[1] == (uchar)addr)) && (buf[2] == (uchar)mid)) {
      bVar1 = buf[3];
      if (6 < buflen || bVar1 != 0xff) {
        if (bVar1 == 0xff) {
          uVar4 = (ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8) + 7;
        }
        else {
          uVar4 = bVar1 + 5;
        }
        if ((int)uVar4 <= buflen) {
          cVar3 = '\0';
          uVar6 = 1;
          do {
            cVar3 = cVar3 + buf[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          if (cVar3 == '\0') {
            bVar2 = true;
            goto LAB_001b9981;
          }
        }
      }
    }
    buf = buf + 1;
    bVar2 = buflen < 6;
    buflen = buflen + -1;
    if (bVar2) {
      buf = (uchar *)0x0;
      buflen = 0;
      bVar2 = false;
LAB_001b9981:
      if (bVar2) {
        do {
          *pFoundMsg = buf;
          *pFoundMsgTmpLen = buflen;
          if (buf[3] == 0xff) {
            uVar4 = (ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8) + 7;
          }
          else {
            uVar4 = buf[3] + 5;
          }
          buf = buf + uVar4;
          buflen = buflen - uVar4;
          do {
            if ((((4 < buflen) && (*buf == 0xfa)) &&
                ((buf[1] == (uchar)addr && (buf[2] == (uchar)mid)))) &&
               ((bVar1 = buf[3], 6 < buflen || (bVar1 != 0xff)))) {
              if (bVar1 == 0xff) {
                uVar4 = (ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8) + 7;
              }
              else {
                uVar4 = bVar1 + 5;
              }
              if ((int)uVar4 <= buflen) {
                cVar3 = '\0';
                uVar6 = 1;
                do {
                  cVar3 = cVar3 + buf[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar4 != uVar6);
                if (cVar3 == '\0') {
                  bVar2 = true;
                  goto LAB_001b9a27;
                }
              }
            }
            buf = buf + 1;
            bVar2 = 5 < buflen;
            buflen = buflen + -1;
          } while (bVar2);
          buf = (uchar *)0x0;
          buflen = 0;
          bVar2 = false;
LAB_001b9a27:
        } while (bVar2);
        iVar5 = 0;
      }
      else {
        *pFoundMsg = (uchar *)0x0;
        *pFoundMsgTmpLen = 0;
        iVar5 = 1;
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

inline int FindLatestMTMessage(unsigned char* buf, int buflen, int addr, int mid, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	unsigned char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindMTMessage(buf, buflen, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected total message length.
		msglen = GetLengthMTMessage(*pFoundMsg);

		// Search just after the message.
		if (FindMTMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, 
			addr, mid, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}